

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_oct.c
# Opt level: O3

REF_STATUS ref_oct_export_tet(REF_OCT ref_oct,REF_INT node,REF_GRID ref_grid,REF_INT *tri_nodes)

{
  uint uVar1;
  long lVar2;
  REF_INT new_cell;
  REF_INT tet_nodes [27];
  
  tet_nodes[0] = *(REF_INT *)((long)ref_oct + ((long)*tri_nodes + (long)node * 0x1b) * 4);
  lVar2 = (long)(int)((long)node * 0x1b);
  tet_nodes[1] = *(REF_INT *)((long)ref_oct->bbox + (tri_nodes[1] + lVar2) * 4);
  tet_nodes[2] = *(REF_INT *)((long)ref_oct->bbox + (tri_nodes[2] + lVar2) * 4);
  tet_nodes[3] = *(REF_INT *)((long)ref_oct[1].bbox + lVar2 * 4 + 0x18);
  uVar1 = ref_cell_add((REF_CELL)ref_grid,tet_nodes,&new_cell);
  if (uVar1 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",0x376,
           "ref_oct_export_tet",(ulong)uVar1,"add tri tet");
    printf("tri %d %d %d tet %d %d %d %d\n",(ulong)(uint)*tri_nodes,(ulong)(uint)tri_nodes[1],
           (ulong)(uint)tri_nodes[2],(ulong)(uint)tet_nodes[0],(ulong)(uint)tet_nodes[1],
           (ulong)(uint)tet_nodes[2],(ulong)(uint)tet_nodes[3]);
  }
  return uVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_oct_export_tet(REF_OCT ref_oct, REF_INT node,
                                             REF_GRID ref_grid,
                                             REF_INT *tri_nodes) {
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_INT tet_nodes[REF_CELL_MAX_SIZE_PER], new_cell;
  tet_nodes[0] = ref_oct_c2n(ref_oct, tri_nodes[0], node);
  tet_nodes[1] = ref_oct_c2n(ref_oct, tri_nodes[1], node);
  tet_nodes[2] = ref_oct_c2n(ref_oct, tri_nodes[2], node);
  tet_nodes[3] = ref_oct_c2n(ref_oct, 26, node);
  RSB(ref_cell_add(ref_cell, tet_nodes, &new_cell), "add tri tet", {
    printf("tri %d %d %d tet %d %d %d %d\n", tri_nodes[0], tri_nodes[1],
           tri_nodes[2], tet_nodes[0], tet_nodes[1], tet_nodes[2],
           tet_nodes[3]);
  });
  return REF_SUCCESS;
}